

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::EmitSwiftDependencyInfo(cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  Value *pVVar1;
  Value local_258;
  Value local_230;
  Value local_208;
  Value local_1e0;
  Value local_1b8;
  undefined1 local_190 [8];
  Value entry;
  undefined1 local_158 [8];
  string makeDepsPath;
  string local_130 [32];
  undefined1 local_110 [8];
  string swiftDiaPath;
  string local_e8 [32];
  undefined1 local_c8 [8];
  string swiftDepsPath;
  undefined1 local_88 [8];
  string objectFilePath;
  string local_58;
  undefined1 local_38 [8];
  string sourceFilePath;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  
  sourceFilePath.field_2._8_8_ = source;
  GetSourceFilePath_abi_cxx11_(&local_58,this,source);
  ConvertToNinjaPath((string *)local_38,this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  GetObjectFilePath_abi_cxx11_
            ((string *)((long)&swiftDepsPath.field_2 + 8),this,
             (cmSourceFile *)sourceFilePath.field_2._8_8_);
  ConvertToNinjaPath((string *)local_88,this,(string *)((long)&swiftDepsPath.field_2 + 8));
  std::__cxx11::string::~string((string *)(swiftDepsPath.field_2._M_local_buf + 8));
  swiftDiaPath.field_2._8_8_ = sourceFilePath.field_2._8_8_;
  std::__cxx11::string::string(local_e8,(string *)local_88);
  EmitSwiftDependencyInfo(cmSourceFile_const*)::$_0::operator()[abi_cxx11_
            ((string *)local_c8,(__0 *)(swiftDiaPath.field_2._M_local_buf + 8));
  EmitSwiftDependencyInfo(cmSourceFile_const*)::$_0::~__0
            ((__0 *)(swiftDiaPath.field_2._M_local_buf + 8));
  makeDepsPath.field_2._8_8_ = sourceFilePath.field_2._8_8_;
  std::__cxx11::string::string(local_130,(string *)local_88);
  EmitSwiftDependencyInfo(cmSourceFile_const*)::$_1::operator()[abi_cxx11_
            ((string *)local_110,(__1 *)(makeDepsPath.field_2._M_local_buf + 8));
  EmitSwiftDependencyInfo(cmSourceFile_const*)::$_1::~__1
            ((__1 *)(makeDepsPath.field_2._M_local_buf + 8));
  entry.limit_ = (ptrdiff_t)this;
  EmitSwiftDependencyInfo(cmSourceFile_const*)::$_2::operator()[abi_cxx11_
            ((string *)local_158,&entry.limit_);
  Json::Value::Value((Value *)local_190,objectValue);
  Json::Value::Value(&local_1b8,(string *)local_88);
  pVVar1 = Json::Value::operator[]((Value *)local_190,"object");
  Json::Value::operator=(pVVar1,&local_1b8);
  Json::Value::~Value(&local_1b8);
  Json::Value::Value(&local_1e0,(string *)local_158);
  pVVar1 = Json::Value::operator[]((Value *)local_190,"dependencies");
  Json::Value::operator=(pVVar1,&local_1e0);
  Json::Value::~Value(&local_1e0);
  Json::Value::Value(&local_208,(string *)local_c8);
  pVVar1 = Json::Value::operator[]((Value *)local_190,"swift-dependencies");
  Json::Value::operator=(pVVar1,&local_208);
  Json::Value::~Value(&local_208);
  Json::Value::Value(&local_230,(string *)local_110);
  pVVar1 = Json::Value::operator[]((Value *)local_190,"diagnostics");
  Json::Value::operator=(pVVar1,&local_230);
  Json::Value::~Value(&local_230);
  Json::Value::Value(&local_258,(Value *)local_190);
  pVVar1 = Json::Value::operator[](&this->SwiftOutputMap,(string *)local_38);
  Json::Value::operator=(pVVar1,&local_258);
  Json::Value::~Value(&local_258);
  Json::Value::~Value((Value *)local_190);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmNinjaTargetGenerator::EmitSwiftDependencyInfo(
  cmSourceFile const* source)
{
  std::string const sourceFilePath =
    this->ConvertToNinjaPath(this->GetSourceFilePath(source));
  std::string const objectFilePath =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source));
  std::string const swiftDepsPath = [source, objectFilePath]() -> std::string {
    if (const char* name = source->GetProperty("Swift_DEPENDENCIES_FILE")) {
      return name;
    }
    return objectFilePath + ".swiftdeps";
  }();
  std::string const swiftDiaPath = [source, objectFilePath]() -> std::string {
    if (const char* name = source->GetProperty("Swift_DIAGNOSTICS_FILE")) {
      return name;
    }
    return objectFilePath + ".dia";
  }();
  std::string const makeDepsPath = [this, source]() -> std::string {
    cmLocalNinjaGenerator const* local = this->GetLocalGenerator();
    std::string const objectFileName =
      this->ConvertToNinjaPath(this->GetObjectFilePath(source));
    std::string const objectFileDir =
      cmSystemTools::GetFilenamePath(objectFileName);

    if (this->Makefile->IsOn("CMAKE_Swift_DEPFLE_EXTNSION_REPLACE")) {
      std::string dependFileName =
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName) + ".d";
      return local->ConvertToOutputFormat(objectFileDir + "/" + dependFileName,
                                          cmOutputConverter::SHELL);
    }
    return local->ConvertToOutputFormat(objectFileName + ".d",
                                        cmOutputConverter::SHELL);
  }();

  // build the source file mapping
  // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
  Json::Value entry = Json::Value(Json::objectValue);
  entry["object"] = objectFilePath;
  entry["dependencies"] = makeDepsPath;
  entry["swift-dependencies"] = swiftDepsPath;
  entry["diagnostics"] = swiftDiaPath;
  SwiftOutputMap[sourceFilePath] = entry;
}